

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float __thiscall
ImGuiSimpleColumns::DeclColumns(ImGuiSimpleColumns *this,float w0,float w1,float w2)

{
  int i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = (float)*(undefined8 *)this->NextWidths;
  fVar5 = (float)((ulong)*(undefined8 *)this->NextWidths >> 0x20);
  uVar2 = -(uint)(w0 <= fVar4);
  uVar3 = -(uint)(w1 <= fVar5);
  *(ulong *)this->NextWidths =
       CONCAT44(~uVar3 & (uint)w1,~uVar2 & (uint)w0) |
       CONCAT44((uint)fVar5 & uVar3,(uint)fVar4 & uVar2);
  uVar2 = -(uint)(w2 <= this->NextWidths[2]);
  this->NextWidths[2] = (float)(~uVar2 & (uint)w2 | (uint)this->NextWidths[2] & uVar2);
  fVar4 = 0.0;
  lVar1 = 0;
  do {
    fVar5 = 0.0;
    if (lVar1 != 0) {
      fVar5 = (float)(-(uint)(0.0 < this->NextWidths[lVar1]) & (uint)this->Spacing);
    }
    fVar4 = fVar4 + this->NextWidths[lVar1] + fVar5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  this->NextWidth = fVar4;
  uVar2 = -(uint)(fVar4 <= this->Width);
  return (float)(~uVar2 & (uint)fVar4 | (uint)this->Width & uVar2);
}

Assistant:

float ImGuiSimpleColumns::DeclColumns(float w0, float w1, float w2) // not using va_arg because they promote float to double
{
    NextWidth = 0.0f;
    NextWidths[0] = ImMax(NextWidths[0], w0);
    NextWidths[1] = ImMax(NextWidths[1], w1);
    NextWidths[2] = ImMax(NextWidths[2], w2);
    for (int i = 0; i < 3; i++)
        NextWidth += NextWidths[i] + ((i > 0 && NextWidths[i] > 0.0f) ? Spacing : 0.0f);
    return ImMax(Width, NextWidth);
}